

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fct.h
# Opt level: O2

int fctstr_ieq(char *s1,char *s2)

{
  char cVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  
  if (s1 == s2) {
LAB_001031ea:
    iVar4 = 1;
  }
  else {
    iVar4 = 0;
    if ((s1 != (char *)0x0 || s2 == (char *)0x0) && (s1 == (char *)0x0 || s2 != (char *)0x0)) {
      iVar4 = 0;
      lVar5 = 0;
      while( true ) {
        cVar1 = s1[lVar5];
        iVar2 = tolower((int)cVar1);
        iVar3 = tolower((int)s2[lVar5]);
        if (iVar2 != iVar3) break;
        if (cVar1 == '\0') goto LAB_001031ea;
        lVar5 = lVar5 + 1;
      }
    }
  }
  return iVar4;
}

Assistant:

static int
fctstr_ieq(char const *s1, char const *s2)
{
    if ( s1 == s2 )
    {
        return 1;
    }
    if ( (s1 == NULL && s2 != NULL)
            || (s1 != NULL && s2 == NULL) )
    {
        return 0;
    }
    while (tolower(*s1) == tolower(*s2))
    {
        if (*s1 == '\0')
            return 1;
        s1++;
        s2++;
    }
    /* Difference detected! */
    return 0;
}